

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

void __thiscall WorldShuffler::randomize_items(WorldShuffler *this)

{
  vector<Item_*,_std::allocator<Item_*>_> *__return_storage_ptr__;
  mapped_type_conflict2 mVar1;
  Item *pIVar2;
  bool bVar3;
  WorldNode *start_node;
  WorldNode *end_node;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *this_00;
  reference ppIVar4;
  size_type sVar5;
  mapped_type_conflict2 *pmVar6;
  vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
  *this_01;
  reference pvVar7;
  reference ppIVar8;
  string *args;
  initializer_list_t init;
  Item *item_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<Item_*,_std::allocator<Item_*>_> *__range2_2;
  undefined1 local_d0 [40];
  Json *local_a8;
  Json *debug_log;
  type *local_88;
  type *item_sources;
  type *item;
  __normal_iterator<const_std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_*,_std::vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>_>
  local_70;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
  *__range2_1;
  ItemSource *source;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range2;
  bool explored_new_nodes;
  vector<Item_*,_std::allocator<Item_*>_> local_28;
  WorldShuffler *local_10;
  WorldShuffler *this_local;
  
  local_10 = this;
  place_fixed_items(this);
  init_item_pool(this);
  start_node = RandomizerWorld::spawn_node(this->_world);
  end_node = RandomizerWorld::end_node(this->_world);
  World::starting_inventory(&local_28,&this->_world->super_World);
  WorldSolver::setup(&this->_solver,start_node,end_node,&local_28);
  std::vector<Item_*,_std::allocator<Item_*>_>::~vector(&local_28);
  __range2._3_1_ = true;
  while (__range2._3_1_ != false) {
    __range2._3_1_ = WorldSolver::run_until_blocked(&this->_solver);
    this_00 = WorldSolver::reachable_item_sources(&this->_solver);
    __end2 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin(this_00);
    source = (ItemSource *)std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end(this_00);
    while (bVar3 = __gnu_cxx::
                   operator==<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                             (&__end2,(__normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                       *)&source), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppIVar4 = __gnu_cxx::
                __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                ::operator*(&__end2);
      __range2_1 = (vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
                    *)*ppIVar4;
      sVar5 = std::
              map<ItemSource_*,_unsigned_short,_std::less<ItemSource_*>,_std::allocator<std::pair<ItemSource_*const,_unsigned_short>_>_>
              ::count(&this->_item_source_spheres,(key_type *)&__range2_1);
      if (sVar5 == 0) {
        mVar1 = this->_current_sphere;
        pmVar6 = std::
                 map<ItemSource_*,_unsigned_short,_std::less<ItemSource_*>,_std::allocator<std::pair<ItemSource_*const,_unsigned_short>_>_>
                 ::operator[](&this->_item_source_spheres,(key_type *)&__range2_1);
        *pmVar6 = mVar1;
      }
      __gnu_cxx::
      __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
      ::operator++(&__end2);
    }
    this_01 = WorldSolver::scheduled_item_placements(&this->_solver);
    __end2_1 = std::
               vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
               ::begin(this_01);
    local_70._M_current =
         (pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_> *)
         std::
         vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
         ::end(this_01);
    while (bVar3 = __gnu_cxx::
                   operator==<const_std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_*,_std::vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>_>
                             (&__end2_1,&local_70), ((bVar3 ^ 0xffU) & 1) != 0) {
      item = &__gnu_cxx::
              __normal_iterator<const_std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_*,_std::vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>_>
              ::operator*(&__end2_1)->first;
      item_sources = (type *)std::
                             get<0ul,Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>
                                       ((pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                         *)item);
      local_88 = std::get<1ul,Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>
                           ((pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                             *)item);
      pIVar2 = (Item *)(item_sources->
                       super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
      std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::vector
                ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&debug_log,local_88);
      place_item_randomly(this,pIVar2,
                          (vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&debug_log);
      std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::~vector
                ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&debug_log);
      __gnu_cxx::
      __normal_iterator<const_std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_*,_std::vector<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>_>
      ::operator++(&__end2_1);
    }
    open_random_blocked_path(this);
    WorldSolver::update_current_inventory(&this->_solver);
    this->_current_sphere = this->_current_sphere + 1;
  }
  place_remaining_items(this);
  local_a8 = WorldSolver::debug_log_abi_cxx11_(&this->_solver);
  bVar3 = RandomizerOptions::archipelago_world(this->_options);
  if (!bVar3) {
    __return_storage_ptr__ = (vector<Item_*,_std::allocator<Item_*>_> *)(local_d0 + 0x10);
    WorldSolver::find_minimal_inventory(__return_storage_ptr__,&this->_solver);
    std::vector<Item_*,_std::allocator<Item_*>_>::operator=
              (&this->_minimal_items_to_complete,__return_storage_ptr__);
    std::vector<Item_*,_std::allocator<Item_*>_>::~vector(__return_storage_ptr__);
    std::
    initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::initializer_list((initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&__range2_2);
    init._M_len = (size_type)__range2_2;
    init._M_array = (iterator)local_d0;
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::array(init);
    pvVar7 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_a8,"requiredItems");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(pvVar7,(basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_d0);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_d0);
    __end2_2 = std::vector<Item_*,_std::allocator<Item_*>_>::begin
                         (&this->_minimal_items_to_complete);
    item_1 = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end
                               (&this->_minimal_items_to_complete);
    while (bVar3 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                             (&__end2_2,
                              (__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                               *)&item_1), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppIVar8 = __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                ::operator*(&__end2_2);
      pIVar2 = *ppIVar8;
      pvVar7 = nlohmann::
               basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)local_a8,"requiredItems");
      args = Item::name_abi_cxx11_(pIVar2);
      nlohmann::
      basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::emplace_back<std::__cxx11::string_const&>
                ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)pvVar7,args);
      __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
      operator++(&__end2_2);
    }
  }
  return;
}

Assistant:

void WorldShuffler::randomize_items()
{
    this->place_fixed_items();
    this->init_item_pool();

    _solver.setup(_world.spawn_node(), _world.end_node(), _world.starting_inventory());

    bool explored_new_nodes = true;
    while(explored_new_nodes)
    {
        // Run a solver step to reach a "blocked" state where something needs to be placed in order to continue
        explored_new_nodes = _solver.run_until_blocked();

        // Update the table of spheres to have accurate data on when an item source was first considered during
        // generation, which is then used to evaluate prices by "logical distance" to starting point
        for(ItemSource* source : _solver.reachable_item_sources())
            if(!_item_source_spheres.count(source))
                _item_source_spheres[source] = _current_sphere;

        // Place all "scheduled" item placements, which correspond to "itemPlacedWhenCrossing" attributes of WorldPaths
        // solver encountered during last step
        for(auto& [item, item_sources] : _solver.scheduled_item_placements())
            this->place_item_randomly(item, item_sources);

        // Place one or several key items in order to open a blocked path
        this->open_random_blocked_path();

        // Item sources changed, force the solver to update its inventory
        _solver.update_current_inventory();

        _current_sphere += 1;
    }

    // Place the remaining items from the item pool in the remaining sources
    this->place_remaining_items();

    // Analyse items required to complete the seed
    Json& debug_log = _solver.debug_log();
    if(!_options.archipelago_world())
    {
        _minimal_items_to_complete = _solver.find_minimal_inventory();
        debug_log["requiredItems"] = Json::array();
        for(Item* item : _minimal_items_to_complete)
            debug_log["requiredItems"].emplace_back(item->name());
    }
}